

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O0

int main(int argc,char **argv)

{
  UT_array *pUVar1;
  int iVar2;
  __pid_t _Var3;
  uint uVar4;
  UT_string *em_00;
  char *pcVar5;
  UT_string *sm_00;
  char *local_238;
  char *local_228;
  char *local_218;
  ulong local_1f8;
  size_t _ut_i_2;
  size_t _ut_i_1;
  size_t _ut_i;
  undefined1 auStack_1d8 [4];
  int signo;
  sigaction sa;
  sigset_t ss;
  sigset_t all;
  UT_string *sm;
  UT_string *em;
  job_t *job;
  int log_opt;
  int opt;
  int n;
  char **argv_local;
  int argc_local;
  
  em_00 = (UT_string *)calloc(0x18,1);
  if (em_00 == (UT_string *)0x0) {
    exit(-1);
  }
  em_00->n = 0;
  em_00->i = 0;
  em_00->d = (char *)0x0;
  if (em_00->n - em_00->i < 100) {
    pcVar5 = (char *)realloc(em_00->d,em_00->n + 100);
    em_00->d = pcVar5;
    if (em_00->d == (char *)0x0) {
      exit(-1);
    }
    em_00->n = em_00->n + 100;
  }
  *em_00->d = '\0';
  sm_00 = (UT_string *)calloc(0x18,1);
  if (sm_00 == (UT_string *)0x0) {
    exit(-1);
  }
  sm_00->n = 0;
  sm_00->i = 0;
  sm_00->d = (char *)0x0;
  if (sm_00->n - sm_00->i < 100) {
    pcVar5 = (char *)realloc(sm_00->d,sm_00->n + 100);
    sm_00->d = pcVar5;
    if (sm_00->d == (char *)0x0) {
      exit(-1);
    }
    sm_00->n = sm_00->n + 100;
  }
  *sm_00->d = '\0';
  while (iVar2 = getopt(argc,argv,"v+p:Fc:s:tIh"), iVar2 != -1) {
    switch(iVar2) {
    case 0x46:
      cfg.foreground = 1;
      break;
    case 0x49:
      cfg.echo_syslog_to_stderr = 1;
      break;
    case 99:
      cfg.file = strdup(_optarg);
      break;
    case 0x68:
    default:
      usage(*argv);
      break;
    case 0x70:
      cfg.pidfile = strdup(_optarg);
      break;
    case 0x74:
      cfg.test_only = 1;
      cfg.foreground = 1;
      break;
    case 0x76:
      cfg.verbose = cfg.verbose + 1;
    }
  }
  cfg.echo_syslog_to_stderr = 1;
  _Var3 = getpid();
  if (_Var3 == 1) {
    cfg.foreground = 1;
  }
  job._4_4_ = 1;
  if ((cfg.echo_syslog_to_stderr != 0) || (iVar2 = isatty(2), iVar2 != 0)) {
    job._4_4_ = 0x21;
  }
  openlog("pmtr",job._4_4_,0x80);
  if (cfg.file == (char *)0x0) {
    cfg.file = strdup("/etc/pmtr.conf");
  }
  if (cfg.foreground == 0) {
    _Var3 = fork();
    if (_Var3 != 0) {
      exit(0);
    }
    setsid();
    close(0);
    close(1);
    close(2);
  }
  sigfillset((sigset_t *)(ss.__val + 0xf));
  sigprocmask(2,(sigset_t *)(ss.__val + 0xf),(sigset_t *)0x0);
  cfg.jobs = (UT_array *)malloc(0x30);
  memset(cfg.jobs,0,0x30);
  pUVar1 = cfg.jobs;
  ((cfg.jobs)->icd).sz = 0x218;
  (pUVar1->icd).init = job_ini;
  (pUVar1->icd).copy = job_cpy;
  (pUVar1->icd).dtor = job_fin;
  cfg.listen = (UT_array *)malloc(0x30);
  memset(cfg.listen,0,0x30);
  pUVar1 = cfg.listen;
  ((cfg.listen)->icd).sz = 4;
  (pUVar1->icd).init = (undefined1 *)0x0;
  (pUVar1->icd).copy = (ctor_f *)0x0;
  (pUVar1->icd).dtor = (undefined1 *)0x0;
  cfg.report = (UT_array *)malloc(0x30);
  memset(cfg.report,0,0x30);
  pUVar1 = cfg.report;
  ((cfg.report)->icd).sz = 4;
  (pUVar1->icd).init = (undefined1 *)0x0;
  (pUVar1->icd).copy = (ctor_f *)0x0;
  (pUVar1->icd).dtor = (undefined1 *)0x0;
  cfg.s = (UT_string *)calloc(0x18,1);
  if (cfg.s == (UT_string *)0x0) {
    exit(-1);
  }
  (cfg.s)->n = 0;
  (cfg.s)->i = 0;
  (cfg.s)->d = (char *)0x0;
  if ((cfg.s)->n - (cfg.s)->i < 100) {
    pcVar5 = (char *)realloc((cfg.s)->d,(cfg.s)->n + 100);
    (cfg.s)->d = pcVar5;
    if ((cfg.s)->d == (char *)0x0) {
      exit(-1);
    }
    (cfg.s)->n = (cfg.s)->n + 100;
  }
  *(cfg.s)->d = '\0';
  iVar2 = make_pidfile();
  if (iVar2 != 0) goto LAB_0010dddf;
  umask(0);
  iVar2 = instantiate_cfg_file(&cfg);
  if (iVar2 == -1) goto LAB_0010dddf;
  iVar2 = parse_jobs(&cfg,em_00);
  if (iVar2 == -1) {
    syslog(3,"parse failed: %s",em_00->d);
    goto LAB_0010dddf;
  }
  if (cfg.test_only != 0) goto LAB_0010dddf;
  syslog(6,"pmtr: starting");
  sigfillset((sigset_t *)&sa.sa_restorer);
  for (log_opt = 0; (uint)log_opt < 8; log_opt = log_opt + 1) {
    sigdelset((sigset_t *)&sa.sa_restorer,sigs[log_opt]);
  }
  _auStack_1d8 = sighandler;
  sa.sa_mask.__val[0xf]._0_4_ = 0;
  sigfillset((sigset_t *)&sa);
  for (log_opt = 0; (uint)log_opt < 8; log_opt = log_opt + 1) {
    sigaction(sigs[log_opt],(sigaction *)auStack_1d8,(sigaction *)0x0);
  }
  uVar4 = __sigsetjmp(jmp,1);
  switch(uVar4) {
  case 0:
    iVar2 = setup_logger();
    if ((iVar2 < 0) || (cfg.logger_pid = start_logger(), cfg.logger_pid == -1)) goto LAB_0010dddf;
    do_jobs(&cfg);
    cfg.dm_pid = dep_monitor(cfg.file);
    if (cfg.dm_pid == -1) goto LAB_0010dddf;
    report_status(&cfg);
    alarm_within(&cfg,10);
    break;
  case 1:
    rescan_config();
    do_jobs(&cfg);
    break;
  default:
    syslog(6,"pmtr: exiting on signal %d",(ulong)uVar4);
    goto LAB_0010dda7;
  case 0xe:
    do_jobs(&cfg);
    report_status(&cfg);
    alarm_within(&cfg,10);
    break;
  case 0x11:
    collect_jobs(&cfg,sm_00);
    do_jobs(&cfg);
    break;
  case 0x1d:
    service_socket(&cfg);
    do_jobs(&cfg);
  }
  sigsuspend((sigset_t *)&sa.sa_restorer);
LAB_0010dda7:
  term_jobs(cfg.jobs);
  do_jobs(&cfg);
  nanosleep((timespec *)&halfsec,(timespec *)0x0);
  collect_jobs(&cfg,sm_00);
LAB_0010dddf:
  close_sockets(&cfg);
  free(cfg.file);
  if ((cfg.jobs)->n != 0) {
    if (((cfg.jobs)->icd).dtor != (undefined1 *)0x0) {
      for (_ut_i_1 = 0; _ut_i_1 < (cfg.jobs)->i; _ut_i_1 = _ut_i_1 + 1) {
        if (_ut_i_1 < (cfg.jobs)->i) {
          local_218 = (cfg.jobs)->d + ((cfg.jobs)->icd).sz * _ut_i_1;
        }
        else {
          local_218 = (char *)0x0;
        }
        (*(code *)((cfg.jobs)->icd).dtor)(local_218);
      }
    }
    free((cfg.jobs)->d);
  }
  (cfg.jobs)->n = 0;
  free(cfg.jobs);
  if ((cfg.listen)->n != 0) {
    if (((cfg.listen)->icd).dtor != (undefined1 *)0x0) {
      for (_ut_i_2 = 0; _ut_i_2 < (cfg.listen)->i; _ut_i_2 = _ut_i_2 + 1) {
        if (_ut_i_2 < (cfg.listen)->i) {
          local_228 = (cfg.listen)->d + ((cfg.listen)->icd).sz * _ut_i_2;
        }
        else {
          local_228 = (char *)0x0;
        }
        (*(code *)((cfg.listen)->icd).dtor)(local_228);
      }
    }
    free((cfg.listen)->d);
  }
  (cfg.listen)->n = 0;
  free(cfg.listen);
  if ((cfg.report)->n != 0) {
    if (((cfg.report)->icd).dtor != (undefined1 *)0x0) {
      for (local_1f8 = 0; local_1f8 < (cfg.report)->i; local_1f8 = local_1f8 + 1) {
        if (local_1f8 < (cfg.report)->i) {
          local_238 = (cfg.report)->d + ((cfg.report)->icd).sz * local_1f8;
        }
        else {
          local_238 = (char *)0x0;
        }
        (*(code *)((cfg.report)->icd).dtor)(local_238);
      }
    }
    free((cfg.report)->d);
  }
  (cfg.report)->n = 0;
  free(cfg.report);
  if ((cfg.s)->d != (char *)0x0) {
    free((cfg.s)->d);
  }
  (cfg.s)->n = 0;
  free(cfg.s);
  if (em_00->d != (char *)0x0) {
    free(em_00->d);
  }
  em_00->n = 0;
  free(em_00);
  if (sm_00->d != (char *)0x0) {
    free(sm_00->d);
  }
  sm_00->n = 0;
  free(sm_00);
  if (cfg.pidfile != (char *)0x0) {
    unlink(cfg.pidfile);
    free(cfg.pidfile);
  }
  if (cfg.logger_fd != -1) {
    close(cfg.logger_fd);
  }
  return 0;
}

Assistant:

int main (int argc, char *argv[]) {
  int n, opt, log_opt;
  job_t *job;

  UT_string *em, *sm;
  utstring_new(em);
  utstring_new(sm);

  while ( (opt = getopt(argc, argv, "v+p:Fc:s:tIh")) != -1) {
    switch (opt) {
      case 'v': cfg.verbose++; break;
      case 'p': cfg.pidfile=strdup(optarg); break;
      case 'F': cfg.foreground=1; break;
      case 'I': cfg.echo_syslog_to_stderr=1; break;
      case 'c': cfg.file=strdup(optarg); break;
      case 't': cfg.test_only=1; cfg.foreground=1; break;
      case 'h': default: usage(argv[0]); break;
    }
  }

  /* always on, nowadays */
  cfg.echo_syslog_to_stderr = 1;

  /* as a container main process, stay in foreground */
  if (getpid() == 1) cfg.foreground = 1;

  log_opt = LOG_PID;
  if (cfg.echo_syslog_to_stderr || isatty(STDERR_FILENO)) log_opt |= LOG_PERROR;
  openlog("pmtr", log_opt, LOG_LOCAL0);
  if (!cfg.file) cfg.file = strdup(DEFAULT_PMTR_CONFIG);

  if (!cfg.foreground) {       /* daemon init */
    if (fork() != 0) exit(0);  /* parent exit */
    setsid();                  /* new session - no controlling terminal */
    close(STDIN_FILENO);
    close(STDOUT_FILENO);
    close(STDERR_FILENO);
  }

  /* block all signals. we remain fully blocked except in sigsuspend */
  sigset_t all;
  sigfillset(&all);
  sigprocmask(SIG_SETMASK,&all,NULL);

  utarray_new(cfg.jobs, &job_mm);
  utarray_new(cfg.listen, &ut_int_icd);
  utarray_new(cfg.report, &ut_int_icd);
  utstring_new(cfg.s);

  if (make_pidfile()) goto final;
  umask(0);

  /* parse config file. we blocked signals above because we can get SIGIO 
   * during parsing if we open UDP listeners and get any datagrams */
  if (instantiate_cfg_file(&cfg) == -1) goto final;
  if (parse_jobs(&cfg, em) == -1) {
    syslog(LOG_ERR,"parse failed: %s", utstring_body(em));
    goto final;
  }

  if (cfg.test_only) goto final;
  syslog(LOG_INFO,"pmtr: starting");

  /* define a smaller set of signals to block within sigsuspend. */
  sigset_t ss;
  sigfillset(&ss);
  for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) sigdelset(&ss, sigs[n]);

  /* establish handlers for signals that we'll unblock in sigsuspend */
  struct sigaction sa;
  sa.sa_handler = sighandler;
  sa.sa_flags = 0;
  sigfillset(&sa.sa_mask);
  for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) sigaction(sigs[n], &sa, NULL);

  /* here is a special line. we'll come back here whenever a signal happens */
  int signo = sigsetjmp(jmp,1);

  switch(signo) {
    case 0:   /* not a signal yet, first time setup */
      if (setup_logger() < 0) goto final;
      cfg.logger_pid = start_logger();
      if (cfg.logger_pid == (pid_t)-1) goto final;
      do_jobs(&cfg);
      cfg.dm_pid = dep_monitor(cfg.file);
      if (cfg.dm_pid == (pid_t)-1) goto final;
      report_status(&cfg);
      alarm_within(&cfg,SHORT_DELAY);
      break;
    case SIGHUP:
      rescan_config();
      do_jobs(&cfg);
      break;
    case SIGCHLD:
      collect_jobs(&cfg,sm);
      do_jobs(&cfg);
      break;
    case SIGALRM:
      do_jobs(&cfg);
      report_status(&cfg);
      alarm_within(&cfg,SHORT_DELAY);
      break;
    case SIGIO:  /* our UDP listener (if enabled) got a datagram */
      service_socket(&cfg);
      do_jobs(&cfg);
      break;
    default:
      syslog(LOG_INFO,"pmtr: exiting on signal %d", signo);
      goto done;
      break;
  }

  /* wait for signals */
  sigsuspend(&ss);

  /* the only way to get past this point 
   * is from the "goto done" above, because 
   * sigsuspend waits for signals, and when
   * one arrives we longjmp back to sigsetjmp! */

 done:
  term_jobs(cfg.jobs);      /* just sets termination flag, so */
  do_jobs(&cfg);            /* run this loop to issue signals */
  nanosleep(&halfsec,NULL); /* a little time to let them exit */
  collect_jobs(&cfg,sm);    /* collect any jobs that exited */

 final:
  close_sockets(&cfg);
  free(cfg.file);
  utarray_free(cfg.jobs);
  utarray_free(cfg.listen);
  utarray_free(cfg.report);
  utstring_free(cfg.s);
  utstring_free(em);
  utstring_free(sm);
  if (cfg.pidfile) {unlink(cfg.pidfile); free(cfg.pidfile);}
  if (cfg.logger_fd != -1) close(cfg.logger_fd);
  return 0;
}